

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode-xid.hh
# Opt level: O2

bool unicode_xid::is_xid_continue(uint32_t codepoint)

{
  bool bVar1;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var2;
  
  if (0x10ffff < codepoint) {
    return false;
  }
  _Var2 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,int,__gnu_cxx::__ops::_Iter_comp_val<unicode_xid::is_xid_continue(unsigned_int)::_lambda(std::pair<int,int>const&,int)_1_>>
                    (detail::kXID_ContinueTable,DAT_0038b270);
  if (((_Var2._M_current == DAT_0038b270) || ((int)codepoint < (_Var2._M_current)->first)) ||
     (bVar1 = true, (_Var2._M_current)->second < (int)codepoint)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool is_xid_continue(uint32_t codepoint) {
  if (codepoint > kMaxCodepoint) {
    return false;
  }

  auto it = std::lower_bound(detail::kXID_ContinueTable.begin(), detail::kXID_ContinueTable.end(), int(codepoint), [](const std::pair<int, int> &a, const int b) {
    return a.second < b;
  });

  if (it != detail::kXID_ContinueTable.end()) {
    if ((int(codepoint) >= it->first) && (int(codepoint) <= it->second)) { // range end is inclusive.
      return true;
    }
  }

  return false;
}